

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O2

_Bool chunk_copy(chunk_conflict *dest,player *p,chunk_conflict *source,wchar_t y0,wchar_t x0,
                wchar_t rotate,_Bool reflect)

{
  monster_group_info *pmVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  int16_t iVar6;
  ushort uVar7;
  wchar_t wVar8;
  wchar_t width;
  uint uVar9;
  bitflag *flags1;
  monster_race *pmVar10;
  monster_group *pmVar11;
  int *piVar12;
  int *piVar13;
  loc grid;
  wchar_t wVar14;
  wchar_t wVar15;
  _Bool _Var16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  square *psVar20;
  object *poVar21;
  trap *ptVar22;
  object **ppoVar23;
  uint32_t uVar24;
  ulong uVar25;
  ulong uVar26;
  ushort uVar27;
  mon_group_list_entry *pmVar28;
  loc grid_00;
  monster *__src;
  monster *pmVar29;
  long lVar30;
  ulong uVar31;
  wchar_t local_140;
  int local_138;
  ghost_info preserved_ghost;
  
  wVar8 = source->height;
  if (dest->height < wVar8 + y0) {
    uVar31 = 0;
  }
  else {
    width = source->width;
    uVar31 = 0;
    if (width + x0 <= dest->width) {
      lVar18 = (ulong)dest->mon_max - 1;
      uVar19 = 0;
      if (L'\0' < width) {
        uVar19 = (ulong)(uint)width;
      }
      uVar25 = 0;
      if (L'\0' < wVar8) {
        uVar25 = (ulong)(uint)wVar8;
      }
      for (; uVar31 != uVar25; uVar31 = uVar31 + 1) {
        for (uVar26 = 0; uVar26 != uVar19; uVar26 = uVar26 + 1) {
          preserved_ghost.bones_selector = (wchar_t)uVar26;
          preserved_ghost.race = (wchar_t)uVar31;
          symmetry_transform((loc_conflict *)&preserved_ghost,y0,x0,wVar8,width,rotate,reflect);
          grid_00 = (loc)(uVar31 << 0x20 | uVar26);
          psVar20 = square(source,grid_00);
          wVar15 = preserved_ghost.race;
          wVar14 = preserved_ghost.bones_selector;
          lVar30 = (long)preserved_ghost.race;
          dest->squares[lVar30][preserved_ghost.bones_selector].feat = psVar20->feat;
          grid.y = preserved_ghost.race;
          grid.x = preserved_ghost.bones_selector;
          psVar20 = square(dest,grid);
          flags1 = psVar20->info;
          psVar20 = square(source,grid_00);
          flag_copy(flags1,psVar20->info,3);
          poVar21 = square_object(source,grid_00);
          if (poVar21 != (object *)0x0) {
            poVar21 = square_object(source,grid_00);
            dest->squares[lVar30][wVar14].obj = poVar21;
            for (poVar21 = square_object(source,grid_00); poVar21 != (object *)0x0;
                poVar21 = poVar21->next) {
              poVar21->grid = grid;
            }
            source->squares[uVar31][uVar26].obj = (object *)0x0;
          }
          psVar20 = square(source,grid_00);
          if (psVar20->trap != (trap *)0x0) {
            psVar20 = square(source,grid_00);
            ptVar22 = psVar20->trap;
            dest->squares[lVar30][wVar14].trap = ptVar22;
            for (; ptVar22 != (trap *)0x0; ptVar22 = ptVar22->next) {
              ptVar22->grid = grid;
            }
            source->squares[uVar31][uVar26].trap = (trap *)0x0;
          }
          psVar20 = square(source,grid_00);
          if (psVar20->mon == -1) {
            dest->squares[lVar30][wVar14].mon = -1;
            (p->grid).x = wVar14;
            (p->grid).y = wVar15;
          }
        }
      }
      uVar2 = source->mon_max;
      uVar4 = source->mon_cnt;
      uVar3 = dest->mon_max;
      uVar5 = dest->mon_cnt;
      dest->mon_max = uVar3 + uVar2;
      dest->mon_cnt = uVar5 + uVar4;
      dest->num_repro = dest->num_repro + source->num_repro;
      local_140 = L'\xffffffff';
      for (uVar31 = 1; local_138 = (int)lVar18, uVar31 < source->mon_max; uVar31 = uVar31 + 1) {
        pmVar10 = source->monsters[uVar31].race;
        if (pmVar10 != (monster_race *)0x0) {
          __src = source->monsters + uVar31;
          pmVar29 = dest->monsters;
          _Var16 = flag_has_dbg(pmVar10->flags,0xc,2,"source_mon->race->flags","RF_PLAYER_GHOST");
          if (_Var16) {
            if (dest->ghost->bones_selector == L'\0') {
              mem_free(dest->ghost);
              dest->ghost = source->ghost;
              source->ghost = (ghost_info *)0x0;
            }
            else {
              if (local_140 != L'\xffffffff') {
                __assert_fail("skipped_ghost_id == -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                              ,0x1bb,
                              "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                             );
              }
              local_140 = __src->midx + local_138;
            }
          }
          pmVar29 = pmVar29 + uVar31 + lVar18;
          memcpy(pmVar29,__src,0x1f0);
          pmVar29->midx = pmVar29->midx + local_138;
          symmetry_transform(&pmVar29->grid,y0,x0,wVar8,width,rotate,reflect);
          iVar6 = (int16_t)pmVar29->midx;
          dest->squares[(pmVar29->grid).y][(pmVar29->grid).x].mon = iVar6;
          if (__src->held_obj != (object *)0x0) {
            pmVar29->held_obj = __src->held_obj;
            ppoVar23 = &__src->held_obj;
            while (poVar21 = *ppoVar23, poVar21 != (object *)0x0) {
              poVar21->held_m_idx = iVar6;
              ppoVar23 = &poVar21->next;
            }
            __src->held_obj = (object *)0x0;
          }
          poVar21 = __src->mimicked_obj;
          if (poVar21 != (object *)0x0) {
            pmVar29->mimicked_obj = poVar21;
            poVar21->mimicking_m_idx = iVar6;
            __src->mimicked_obj = (object *)0x0;
          }
        }
      }
      uVar27 = z_info->level_monster_max;
      uVar19 = 0;
      for (uVar31 = 1; uVar31 < uVar27; uVar31 = uVar31 + 1) {
        if (dest->monster_groups[uVar31] != (monster_group *)0x0) {
          uVar19 = uVar31 & 0xffffffff;
        }
      }
      iVar17 = (int)uVar19;
      for (lVar18 = 1; lVar18 < (int)((uint)uVar27 - iVar17); lVar18 = lVar18 + 1) {
        pmVar11 = source->monster_groups[lVar18];
        dest->monster_groups[lVar18 + iVar17] = pmVar11;
        if (pmVar11 != (monster_group *)0x0) {
          pmVar28 = pmVar11->member_list;
          pmVar11->index = pmVar11->index + iVar17;
          pmVar11->leader = pmVar11->leader + local_138;
          for (; pmVar28 != (mon_group_list_entry *)0x0; pmVar28 = pmVar28->next) {
            lVar30 = (long)pmVar28->midx + (long)local_138;
            pmVar29 = dest->monsters;
            wVar8 = pmVar29[lVar30].midx;
            pmVar28->midx = wVar8;
            if (wVar8 != (wchar_t)lVar30) {
              __assert_fail("entry->midx == mon_skip + idx",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                            ,0x1f6,
                            "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                           );
            }
            pmVar1 = pmVar29[lVar30].group_info;
            pmVar1->index = pmVar1->index + iVar17;
          }
        }
        uVar27 = z_info->level_monster_max;
      }
      monster_groups_verify(dest);
      ppoVar23 = (object **)
                 mem_realloc(dest->objects,
                             (ulong)((uint)source->obj_max + (uint)dest->obj_max) * 8 + 0x10);
      dest->objects = ppoVar23;
      uVar27 = source->obj_max;
      uVar7 = dest->obj_max;
      for (lVar18 = 0; (ulong)uVar27 + 1 != lVar18; lVar18 = lVar18 + 1) {
        dest->objects[(ulong)uVar7 + lVar18] = source->objects[lVar18];
        if (dest->objects[(ulong)uVar7 + lVar18] != (object *)0x0) {
          dest->objects[(ulong)uVar7 + lVar18]->oidx = uVar7 + (short)lVar18;
        }
        source->objects[lVar18] = (object *)0x0;
      }
      dest->obj_max = uVar27 + uVar7 + 1;
      source->obj_max = 1;
      object_lists_check_integrity(dest,(chunk_conflict *)0x0);
      uVar27 = z_info->f_max;
      piVar12 = source->feat_count;
      piVar13 = dest->feat_count;
      for (lVar18 = 0; (ulong)uVar27 + 1 != lVar18; lVar18 = lVar18 + 1) {
        piVar13[lVar18] = piVar13[lVar18] + piVar12[lVar18];
      }
      uVar24 = 0xffffffff;
      if (!CARRY4(source->obj_rating,dest->obj_rating)) {
        uVar24 = source->obj_rating + dest->obj_rating;
      }
      dest->obj_rating = uVar24;
      add_to_monster_rating((chunk *)dest,source->mon_rating);
      if (source->good_item == true) {
        dest->good_item = true;
      }
      uVar31 = 1;
      if (local_140 != L'\xffffffff') {
        memcpy(&preserved_ghost,dest->ghost,0xb0);
        delete_monster_idx((chunk *)dest,local_140);
        memcpy(dest->ghost,&preserved_ghost,0xb0);
        uVar9 = dest->mon_rating;
        if (uVar9 != 0xffffffff) {
          if (uVar9 < 10) {
            __assert_fail("dest->mon_rating >= 10",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                          ,0x229,
                          "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                         );
          }
          dest->mon_rating = uVar9 - 10;
        }
      }
    }
  }
  return SUB81(uVar31,0);
}

Assistant:

bool chunk_copy(struct chunk *dest, struct player *p, struct chunk *source,
		int y0, int x0, int rotate, bool reflect)
{
	int i, max_group_id = 0;
	struct loc grid;
	int h = source->height, w = source->width;
	int mon_skip = dest->mon_max - 1;
	int skipped_ghost_id = -1;

	/* Check bounds */
	if (rotate % 1) {
		if ((w + y0 > dest->height) || (h + x0 > dest->width))
			return false;
	} else {
		if ((h + y0 > dest->height) || (w + x0 > dest->width))
			return false;
	}

	/* Write the location stuff (terrain, objects, traps) */
	for (grid.y = 0; grid.y < h; grid.y++) {
		for (grid.x = 0; grid.x < w; grid.x++) {
			/* Work out where we're going */
			struct loc dest_grid = grid;
			symmetry_transform(&dest_grid, y0, x0, h, w, rotate, reflect);

			/* Terrain */
			dest->squares[dest_grid.y][dest_grid.x].feat =
				square(source, grid)->feat;
			sqinfo_copy(square(dest, dest_grid)->info,
						square(source, grid)->info);

			/* Dungeon objects */
			if (square_object(source, grid)) {
				struct object *obj;
				dest->squares[dest_grid.y][dest_grid.x].obj =
					square_object(source, grid);

				for (obj = square_object(source, grid); obj; obj = obj->next) {
					/* Adjust position */
					obj->grid = dest_grid;
				}
				source->squares[grid.y][grid.x].obj = NULL;
			}

			/* Traps */
			if (square(source, grid)->trap) {
				struct trap *trap = square(source, grid)->trap;
				dest->squares[dest_grid.y][dest_grid.x].trap = trap;

				/* Traverse the trap list */
				while (trap) {
					/* Adjust location */
					trap->grid = dest_grid;
					trap = trap->next;
				}
				source->squares[grid.y][grid.x].trap = NULL;
			}

			/* Player */
			if (square(source, grid)->mon == -1) {
				dest->squares[dest_grid.y][dest_grid.x].mon = -1;
				p->grid = dest_grid;
			}
		}
	}

	/* Monsters */
	dest->mon_max += source->mon_max;
	dest->mon_cnt += source->mon_cnt;
	dest->num_repro += source->num_repro;
	for (i = 1; i < source->mon_max; i++) {
		struct monster *source_mon = &source->monsters[i];
		struct monster *dest_mon = &dest->monsters[mon_skip + i];

		/* Valid monster */
		if (!source_mon->race) continue;

		/* Deal with player ghosts */
		if (source_mon->race &&
			rf_has(source_mon->race->flags, RF_PLAYER_GHOST)) {
			/*
			 * Only allow one ghost, preferring the ghost from
			 * the destination if both chunks have a ghost.
			 * Remember a ghost from the source that was not
			 * put in dest->ghost so it can be deleted once the
			 * monsters and monster groups are copied.
			 */
			if (dest->ghost->bones_selector) {
				/* source should not have multiple ghosts. */
				assert(skipped_ghost_id == -1);
				skipped_ghost_id = source_mon->midx + mon_skip;
			} else {
				/* Shift the ghost */
				mem_free(dest->ghost);
				dest->ghost = source->ghost;
				source->ghost = NULL;
			}
		}

		/* Copy */
		memcpy(dest_mon, source_mon, sizeof(struct monster));

		/* Adjust monster index */
		dest_mon->midx += mon_skip;

		/* Move grid */
		symmetry_transform(&dest_mon->grid, y0, x0, h, w, rotate, reflect);
		dest->squares[dest_mon->grid.y][dest_mon->grid.x].mon = dest_mon->midx;

		/* Held or mimicked objects */
		if (source_mon->held_obj) {
			struct object *obj;
			dest_mon->held_obj = source_mon->held_obj;
			for (obj = source_mon->held_obj; obj; obj = obj->next) {
				obj->held_m_idx = dest_mon->midx;
			}
			source_mon->held_obj = NULL;
		}
		if (source_mon->mimicked_obj) {
			dest_mon->mimicked_obj = source_mon->mimicked_obj;
			dest_mon->mimicked_obj->mimicking_m_idx =
				dest_mon->midx;
			source_mon->mimicked_obj = NULL;
		}
	}

	/* Find max monster group id */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (dest->monster_groups[i]) max_group_id = i;
	}

	/* Copy monster groups */
	for (i = 1; i < z_info->level_monster_max - max_group_id; i++) {
		struct monster_group *group = source->monster_groups[i];
		struct mon_group_list_entry *entry;

		/* Copy monster group list */
		dest->monster_groups[i + max_group_id] = source->monster_groups[i];

		/* Adjust monster group indices */
		if (!group) continue;
		entry = group->member_list;
		group->index += max_group_id;
		group->leader += mon_skip;
		while (entry) {
			int idx = entry->midx;
			struct monster *mon = &dest->monsters[mon_skip + idx];
			entry->midx = mon->midx;
			assert(entry->midx == mon_skip + idx);
			mon->group_info[0].index += max_group_id;
			entry = entry->next;
		}
	}
	monster_groups_verify(dest);

	/* Copy object list */
	dest->objects = mem_realloc(dest->objects,
								(dest->obj_max + source->obj_max + 2)
								* sizeof(struct object*));
	for (i = 0; i <= source->obj_max; i++) {
		dest->objects[dest->obj_max + i] = source->objects[i];
		if (dest->objects[dest->obj_max + i] != NULL)
			dest->objects[dest->obj_max + i]->oidx = dest->obj_max + i;
		source->objects[i] = NULL;
	}
	dest->obj_max += source->obj_max + 1;
	source->obj_max = 1;
	object_lists_check_integrity(dest, NULL);

	/* Miscellany */
	for (i = 0; i < z_info->f_max + 1; i++)
		dest->feat_count[i] += source->feat_count[i];

	if (dest->obj_rating < UINT32_MAX - source->obj_rating) {
		dest->obj_rating += source->obj_rating;
	} else {
		dest->obj_rating = UINT32_MAX;
	}
	add_to_monster_rating(dest, source->mon_rating);

	if (source->good_item)
		dest->good_item = true;

	if (skipped_ghost_id != -1) {
		/*
		 * dest->ghost does not refer to the ghost at skipped_ghost_id
		 * so remember it and restore it after delete_monster_idx()
		 * does its work.
		 */
		struct ghost_info preserved_ghost = *dest->ghost;

		delete_monster_idx(dest, skipped_ghost_id);
		*dest->ghost = preserved_ghost;
		/*
		 * Compensate for the change to monster rating, but do
		 * nothing if it saturated:  do not know what to subtract
		 * in that case.
		 */
		if (dest->mon_rating != UINT32_MAX) {
			assert(dest->mon_rating >= 10);
			dest->mon_rating -= 10;
		}
	}

	return true;
}